

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::SparseSupportVectors::ByteSizeLong(SparseSupportVectors *this)

{
  uint uVar1;
  int iVar2;
  SparseVector *value;
  size_t sVar3;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  SparseSupportVectors *this_local;
  
  uVar1 = vectors_size(this);
  _i = (ulong)uVar1;
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = vectors(this,local_20);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SparseVector>(value);
    _i = sVar3 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t SparseSupportVectors::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SparseSupportVectors)
  size_t total_size = 0;

  // repeated .CoreML.Specification.SparseVector vectors = 1;
  {
    unsigned int count = this->vectors_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->vectors(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}